

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O2

int __thiscall
vkt::shaderexecutor::DefaultSampling<int>::genRandom
          (DefaultSampling<int> *this,FloatFormat *param_1,Precision prec,Random *rnd)

{
  bool bVar1;
  int iVar2;
  
  if (prec < PRECISION_LAST) {
    iVar2 = *(int *)(&DAT_009d0714 + (ulong)prec * 4);
  }
  else {
    iVar2 = -2;
  }
  iVar2 = de::Random::getInt(rnd,0,iVar2);
  bVar1 = de::Random::getBool(rnd);
  iVar2 = de::Random::getInt(rnd,0,1 << ((byte)iVar2 & 0x1f));
  if (bVar1) {
    iVar2 = -iVar2;
  }
  return iVar2;
}

Assistant:

int		genRandom	(const FloatFormat&, Precision prec, Random& rnd) const
	{
		const int	exp		= rnd.getInt(0, getNumBits(prec)-2);
		const int	sign	= rnd.getBool() ? -1 : 1;

		return sign * rnd.getInt(0, (deInt32)1 << exp);
	}